

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-quantize-perf.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  size_type __n;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar1;
  size_t n;
  bool bVar2;
  size_t sVar3;
  pointer pbVar4;
  pointer pbVar5;
  pointer puVar6;
  int64_t iterations;
  bool bVar7;
  bool bVar8;
  int iVar9;
  uint uVar10;
  long lVar11;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var12;
  size_t sVar13;
  long *plVar14;
  long lVar15;
  uintptr_t __intptr;
  undefined8 uVar16;
  int iVar17;
  int i;
  ulong uVar18;
  char *pcVar19;
  ulong uVar20;
  pointer puVar21;
  ulong uVar22;
  pointer puVar23;
  float fVar24;
  size_t size_1;
  string op;
  ggml_type_traits_cpu *qfns_cpu;
  float *test_q1;
  float *test_data1;
  quantize_perf_params local_138;
  ggml_type_traits *qfns;
  vector<unsigned_char,_std::allocator<unsigned_char>_> test_data1_v;
  float *test_q2;
  undefined8 local_c8;
  float *local_c0;
  float *test_out;
  string arg;
  vector<unsigned_char,_std::allocator<unsigned_char>_> test_data2_v;
  vector<unsigned_char,_std::allocator<unsigned_char>_> test_out_v;
  vector<unsigned_char,_std::allocator<unsigned_char>_> test_q2_v;
  vector<unsigned_char,_std::allocator<unsigned_char>_> test_q1_v;
  
  local_138.alignment_offset._0_4_ = 0;
  local_138.alignment_offset._4_4_ = 0;
  local_138.op_quantize_row_q_reference = false;
  local_138.op_quantize_row_q = false;
  local_138.op_dequantize_row_q = false;
  local_138.op_quantize_row_q_dot = false;
  local_138.op_vec_dot_q = false;
  local_138.test_sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (size_t *)0x0;
  local_138.test_sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_5_ = 0;
  local_138.test_sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._5_3_ = 0;
  local_138.include_types.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_138.test_sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (size_t *)0x0;
  arg._M_dataplus._M_p = (pointer)&arg.field_2;
  arg._M_string_length = 0;
  local_138.include_types.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_138.include_types.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_138.iterations = 10;
  arg.field_2._M_local_buf[0] = '\0';
  bVar8 = false;
  for (iVar17 = 1; iVar17 < argc; iVar17 = iVar17 + 1) {
    std::__cxx11::string::assign((char *)&arg);
    bVar7 = std::operator==(&arg,"--size");
    if (!bVar7) {
      bVar7 = std::operator==(&arg,"-3");
      if (bVar7) {
        op._M_dataplus._M_p = (pointer)0x1000;
        pvVar1 = &local_138.test_sizes;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                  (pvVar1,(unsigned_long *)&op);
        op._M_dataplus._M_p = (pointer)0x10000;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                  (pvVar1,(unsigned_long *)&op);
        op._M_dataplus._M_p = (pointer)0xa0000;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                  (pvVar1,(unsigned_long *)&op);
        goto LAB_00102737;
      }
      bVar7 = std::operator==(&arg,"-4");
      if (bVar7) {
        op._M_dataplus._M_p = (pointer)0x1000;
        pvVar1 = &local_138.test_sizes;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                  (pvVar1,(unsigned_long *)&op);
        op._M_dataplus._M_p = (pointer)0x10000;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                  (pvVar1,(unsigned_long *)&op);
        op._M_dataplus._M_p = (pointer)0xa0000;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                  (pvVar1,(unsigned_long *)&op);
        op._M_dataplus._M_p = (pointer)0x3e80000;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                  (pvVar1,(unsigned_long *)&op);
        goto LAB_00102737;
      }
      bVar7 = std::operator==(&arg,"--op");
      if (!bVar7) {
        bVar7 = std::operator==(&arg,"--type");
        if (bVar7) {
          iVar17 = iVar17 + 1;
          if (iVar17 < argc) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&op,argv[iVar17],(allocator<char> *)&test_data1_v);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_138,&op);
            std::__cxx11::string::~string((string *)&op);
            goto LAB_00102737;
          }
          goto LAB_00103068;
        }
        bVar7 = std::operator==(&arg,"--alignment-offset");
        if (bVar7) {
          iVar17 = iVar17 + 1;
          if (iVar17 < argc) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&op,argv[iVar17],(allocator<char> *)&test_data1_v);
            uVar10 = std::__cxx11::stoi(&op,(size_t *)0x0,10);
            std::__cxx11::string::~string((string *)&op);
            if (uVar10 < 0x41) {
              local_138.alignment_offset._4_4_ = 0;
              local_138.alignment_offset._0_4_ = uVar10;
              goto LAB_00102737;
            }
            pcVar19 = "error: alignment-offset must be less than %d\n";
            uVar16 = 0x40;
LAB_00103245:
            fprintf(_stderr,pcVar19,uVar16);
          }
          goto LAB_00103068;
        }
        bVar7 = std::operator==(&arg,"-i");
        if (bVar7) {
LAB_00102677:
          iVar17 = iVar17 + 1;
          if (iVar17 < argc) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&op,argv[iVar17],(allocator<char> *)&test_data1_v);
            uVar10 = std::__cxx11::stoi(&op,(size_t *)0x0,10);
            std::__cxx11::string::~string((string *)&op);
            if (uVar10 < 0x5f5e101) {
              local_138.iterations = (int64_t)uVar10;
              goto LAB_00102737;
            }
            pcVar19 = "error: iterations must be less than %d\n";
            uVar16 = 100000000;
            goto LAB_00103245;
          }
          goto LAB_00103068;
        }
        bVar7 = std::operator==(&arg,"--iterations");
        if (bVar7) goto LAB_00102677;
        bVar8 = std::operator==(&arg,"-h");
        if (!bVar8) {
          bVar8 = std::operator==(&arg,"--help");
          if (!bVar8) {
            pcVar19 = "error: unknown argument: %s\n";
            goto LAB_00103081;
          }
        }
        puts("Benchmark quantization specific functions on synthetic data");
        putchar(10);
        printf("usage: %s [options]\n",*argv);
        putchar(10);
        puts("options: (default)");
        puts("  -h, --help            show this help message and exit");
        printf("  --size SIZE           set test size, divisible by 32 (L1_SIZE:%d)\n",0x1000);
        printf("  -3                    use size as L1, L2, L3 sizes (L1:%d L2:%d L3:%d)\n",0x1000,
               0x10000,0xa0000);
        printf("  -4                    use size as L1, L2, L3, MEM sizes (L1:%d L2:%d L3:%d MEM:%d)\n"
               ,0x1000,0x10000,0xa0000,0x3e80000);
        puts(
            "  --op OP               set test operation as quantize_row_q_reference, quantize_row_q, dequantize_row_q,"
            );
        puts("                        quantize_row_q_dot, vec_dot_q (all)");
        printf("  --type TYPE           set test type as");
        for (iVar17 = 0; iVar17 != 0x27; iVar17 = iVar17 + 1) {
          lVar11 = ggml_get_type_traits(iVar17);
          plVar14 = (long *)ggml_get_type_traits_cpu(iVar17);
          lVar15 = ggml_type_name(iVar17);
          if (((lVar15 != 0) && (*plVar14 != 0)) && (*(long *)(lVar11 + 0x28) != 0)) {
            uVar16 = ggml_type_name(iVar17);
            printf(" %s",uVar16);
          }
        }
        puts(" (all)");
        puts("  --alignment-offset OFFSET");
        puts("                        set alignment offset as OFFSET (0)");
        puts("  -i NUM, --iterations NUM");
        printf("                        set test iteration number (%d)\n",10);
        goto LAB_00103088;
      }
      iVar17 = iVar17 + 1;
      if (argc <= iVar17) goto LAB_00103068;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&op,argv[iVar17],(allocator<char> *)&test_data1_v);
      bVar7 = std::operator==(&op,"quantize_row_q_reference");
      if (bVar7) {
        local_138.op_quantize_row_q_reference = true;
LAB_0010271f:
        bVar7 = true;
        bVar2 = false;
      }
      else {
        bVar7 = std::operator==(&op,"quantize_row_q");
        if (bVar7) {
          local_138.op_quantize_row_q = true;
          goto LAB_0010271f;
        }
        bVar7 = std::operator==(&op,"dequantize_row_q");
        if (bVar7) {
          local_138.op_dequantize_row_q = true;
          goto LAB_0010271f;
        }
        bVar7 = std::operator==(&op,"quantize_row_q_dot");
        if (bVar7) {
          local_138.op_quantize_row_q_dot = true;
          goto LAB_0010271f;
        }
        bVar7 = std::operator==(&op,"vec_dot_q");
        if (bVar7) {
          local_138.op_vec_dot_q = true;
          goto LAB_0010271f;
        }
        bVar2 = true;
        bVar7 = false;
        bVar8 = true;
      }
      std::__cxx11::string::~string((string *)&op);
      if (bVar7) goto LAB_00102737;
      iVar17 = 0;
      if (!bVar2) goto LAB_00103022;
      break;
    }
    iVar17 = iVar17 + 1;
    if (argc <= iVar17) goto LAB_00103068;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&op,argv[iVar17],(allocator<char> *)&test_data2_v);
    iVar9 = std::__cxx11::stoi(&op,(size_t *)0x0,10);
    puVar21 = (pointer)(long)iVar9;
    std::__cxx11::string::~string((string *)&op);
    test_data1_v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = puVar21;
    if (((ulong)puVar21 & 0x1f) != 0) {
      fprintf(_stderr,"error: size %zu not divisible by 32\n",puVar21);
      goto LAB_00103068;
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (&local_138.test_sizes,(value_type_conflict *)&test_data1_v);
LAB_00102737:
  }
  if (bVar8) {
LAB_00103068:
    pcVar19 = "error: invalid parameter for argument: %s\n";
LAB_00103081:
    fprintf(_stderr,pcVar19,arg._M_dataplus._M_p);
LAB_00103088:
    iVar17 = 1;
  }
  else {
    if (local_138.test_sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        local_138.test_sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      op._M_dataplus._M_p = (pointer)0x1000;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                (&local_138.test_sizes,(unsigned_long *)&op);
    }
    if (((local_138.op_quantize_row_q_reference == false) && (local_138.op_quantize_row_q == false))
       && ((local_138.op_dequantize_row_q == false &&
           ((local_138.op_quantize_row_q_dot == false && (local_138.op_vec_dot_q == false)))))) {
      local_138.op_vec_dot_q = true;
      local_138.op_quantize_row_q_reference = true;
      local_138.op_quantize_row_q = true;
      local_138.op_dequantize_row_q = true;
      local_138.op_quantize_row_q_dot = true;
    }
    std::
    __sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (local_138.test_sizes.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_138.test_sizes.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish);
    n = local_138.test_sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_finish[-1];
    __n = n * 4 + 0x80;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&test_data1_v,__n,(allocator_type *)&op);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&test_data2_v,__n,(allocator_type *)&op);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&test_q1_v,__n,(allocator_type *)&op);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&test_q2_v,__n,(allocator_type *)&op);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&test_out_v,__n,(allocator_type *)&op);
    lVar11 = (long)(int)(uint)local_138.alignment_offset;
    uVar22 = 0;
    uVar18 = (ulong)(test_data1_v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start + 0x3f) & 0xffffffffffffffc0;
    if (0xc0 < ((ulong)(test_data1_v.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start + 0x3f) & 0xffffffffffffffc0) -
               (long)test_data1_v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start) {
      uVar18 = uVar22;
    }
    test_data1 = (float *)(uVar18 + lVar11);
    uVar18 = (ulong)(test_data2_v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start + 0x3f) & 0xffffffffffffffc0;
    if (0xc0 < ((ulong)(test_data2_v.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start + 0x3f) & 0xffffffffffffffc0) -
               (long)test_data2_v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start) {
      uVar18 = uVar22;
    }
    uVar20 = (ulong)(test_q1_v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start + 0x3f) & 0xffffffffffffffc0;
    if (0xc0 < ((ulong)(test_q1_v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start + 0x3f) & 0xffffffffffffffc0) -
               (long)test_q1_v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start) {
      uVar20 = uVar22;
    }
    test_q1 = (float *)(uVar20 + lVar11);
    uVar20 = (ulong)(test_q2_v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start + 0x3f) & 0xffffffffffffffc0;
    if (0xc0 < ((ulong)(test_q2_v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start + 0x3f) & 0xffffffffffffffc0) -
               (long)test_q2_v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start) {
      uVar20 = uVar22;
    }
    test_q2 = (float *)(uVar20 + lVar11);
    uVar20 = (ulong)(test_out_v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start + 0x3f) & 0xffffffffffffffc0;
    if (0xc0 < ((ulong)(test_out_v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                        ._M_impl.super__Vector_impl_data._M_start + 0x3f) & 0xffffffffffffffc0) -
               (long)test_out_v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start) {
      uVar20 = uVar22;
    }
    test_out = (float *)(uVar20 + lVar11);
    generate_data(0.0,n,test_data1);
    local_c0 = (float *)(uVar18 + lVar11);
    generate_data(1.0,n,(float *)(uVar18 + lVar11));
    iterations = local_138.iterations;
    local_c8 = ggml_init();
    for (; (int)uVar22 != 0x27; uVar22 = (ulong)((int)uVar22 + 1)) {
      qfns = (ggml_type_traits *)ggml_get_type_traits(uVar22);
      qfns_cpu = (ggml_type_traits_cpu *)ggml_get_type_traits_cpu(uVar22);
      if (local_138.include_types.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_138.include_types.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
LAB_00102a05:
        if ((qfns_cpu->from_float != (ggml_from_float_t)0x0) &&
           (qfns->to_float != (ggml_to_float_t)0x0)) {
          pcVar19 = (char *)ggml_type_name(uVar22);
          puts(pcVar19);
          ggml_quantize_init(uVar22);
          if (local_138.op_quantize_row_q_reference == true) {
            puts("  quantize_row_q_reference");
            puVar6 = local_138.test_sizes.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            for (puVar23 = local_138.test_sizes.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start; puVar23 != puVar6;
                puVar23 = puVar23 + 1) {
              size_1 = *puVar23;
              uVar18 = size_1 * 4;
              if ((long)uVar18 < 0) {
                fVar24 = (float)(uVar18 >> 1) + (float)(uVar18 >> 1);
              }
              else {
                fVar24 = (float)(long)uVar18;
              }
              printf("    %zu values (%.2f MB)\n",SUB84((double)(fVar24 * 9.536743e-07),0));
              sVar13 = ggml_row_size(uVar22,size_1);
              sVar3 = size_1;
              op.field_2._M_allocated_capacity = 0;
              op.field_2._8_8_ = 0;
              op._M_dataplus._M_p = (pointer)0x0;
              op._M_string_length = 0;
              op._M_dataplus._M_p = (pointer)operator_new(0x20);
              *(ggml_type_traits ***)op._M_dataplus._M_p = &qfns;
              *(float ***)((long)op._M_dataplus._M_p + 8) = &test_data1;
              *(float ***)((long)op._M_dataplus._M_p + 0x10) = &test_q1;
              *(size_t **)((long)op._M_dataplus._M_p + 0x18) = &size_1;
              op.field_2._8_8_ =
                   std::
                   _Function_handler<float_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-quantize-perf.cpp:289:40)>
                   ::_M_invoke;
              op.field_2._M_allocated_capacity =
                   (size_type)
                   std::
                   _Function_handler<float_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-quantize-perf.cpp:289:40)>
                   ::_M_manager;
              benchmark_function(sVar3,sVar13,iterations,(function<float_()> *)&op);
              std::_Function_base::~_Function_base((_Function_base *)&op);
            }
            putchar(10);
          }
          if (local_138.op_quantize_row_q == true) {
            puts("  quantize_row_q");
            puVar6 = local_138.test_sizes.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            for (puVar23 = local_138.test_sizes.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start; puVar23 != puVar6;
                puVar23 = puVar23 + 1) {
              size_1 = *puVar23;
              uVar18 = size_1 * 4;
              if ((long)uVar18 < 0) {
                fVar24 = (float)(uVar18 >> 1) + (float)(uVar18 >> 1);
              }
              else {
                fVar24 = (float)(long)uVar18;
              }
              printf("    %zu values (%.2f MB)\n",SUB84((double)(fVar24 * 9.536743e-07),0));
              sVar13 = ggml_row_size(uVar22,size_1);
              sVar3 = size_1;
              op.field_2._M_allocated_capacity = 0;
              op.field_2._8_8_ = 0;
              op._M_dataplus._M_p = (pointer)0x0;
              op._M_string_length = 0;
              op._M_dataplus._M_p = (pointer)operator_new(0x20);
              *(ggml_type_traits_cpu ***)op._M_dataplus._M_p = &qfns_cpu;
              *(float ***)((long)op._M_dataplus._M_p + 8) = &test_data1;
              *(float ***)((long)op._M_dataplus._M_p + 0x10) = &test_q1;
              *(size_t **)((long)op._M_dataplus._M_p + 0x18) = &size_1;
              op.field_2._8_8_ =
                   std::
                   _Function_handler<float_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-quantize-perf.cpp:303:40)>
                   ::_M_invoke;
              op.field_2._M_allocated_capacity =
                   (size_type)
                   std::
                   _Function_handler<float_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-quantize-perf.cpp:303:40)>
                   ::_M_manager;
              benchmark_function(sVar3,sVar13,iterations,(function<float_()> *)&op);
              std::_Function_base::~_Function_base((_Function_base *)&op);
            }
            putchar(10);
          }
          if (local_138.op_dequantize_row_q == true) {
            puts("  dequantize_row_q");
            (*qfns_cpu->from_float)(test_data1,test_q1,n);
            puVar6 = local_138.test_sizes.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            for (puVar23 = local_138.test_sizes.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start; puVar23 != puVar6;
                puVar23 = puVar23 + 1) {
              size_1 = *puVar23;
              uVar18 = size_1 * 4;
              if ((long)uVar18 < 0) {
                fVar24 = (float)(uVar18 >> 1) + (float)(uVar18 >> 1);
              }
              else {
                fVar24 = (float)(long)uVar18;
              }
              printf("    %zu values (%.2f MB)\n",SUB84((double)(fVar24 * 9.536743e-07),0));
              sVar13 = ggml_row_size(uVar22,size_1);
              sVar3 = size_1;
              op.field_2._M_allocated_capacity = 0;
              op.field_2._8_8_ = 0;
              op._M_dataplus._M_p = (pointer)0x0;
              op._M_string_length = 0;
              op._M_dataplus._M_p = (pointer)operator_new(0x20);
              *(ggml_type_traits ***)op._M_dataplus._M_p = &qfns;
              *(float ***)((long)op._M_dataplus._M_p + 8) = &test_q1;
              *(float ***)((long)op._M_dataplus._M_p + 0x10) = &test_out;
              *(size_t **)((long)op._M_dataplus._M_p + 0x18) = &size_1;
              op.field_2._8_8_ =
                   std::
                   _Function_handler<float_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-quantize-perf.cpp:318:40)>
                   ::_M_invoke;
              op.field_2._M_allocated_capacity =
                   (size_type)
                   std::
                   _Function_handler<float_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-quantize-perf.cpp:318:40)>
                   ::_M_manager;
              benchmark_function(sVar3,sVar13,iterations,(function<float_()> *)&op);
              std::_Function_base::~_Function_base((_Function_base *)&op);
            }
            putchar(10);
          }
          if (local_138.op_quantize_row_q_dot == true) {
            puts("  quantize_row_q_dot");
            puVar6 = local_138.test_sizes.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            for (puVar23 = local_138.test_sizes.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start; puVar23 != puVar6;
                puVar23 = puVar23 + 1) {
              size_1 = *puVar23;
              uVar18 = size_1 * 4;
              if ((long)uVar18 < 0) {
                fVar24 = (float)(uVar18 >> 1) + (float)(uVar18 >> 1);
              }
              else {
                fVar24 = (float)(long)uVar18;
              }
              printf("    %zu values (%.2f MB)\n",SUB84((double)(fVar24 * 9.536743e-07),0));
              sVar13 = ggml_row_size(uVar22,size_1);
              sVar3 = size_1;
              op.field_2._M_allocated_capacity = 0;
              op.field_2._8_8_ = 0;
              op._M_dataplus._M_p = (pointer)0x0;
              op._M_string_length = 0;
              op._M_dataplus._M_p = (pointer)operator_new(0x20);
              *(ggml_type_traits_cpu ***)op._M_dataplus._M_p = &qfns_cpu;
              *(float ***)((long)op._M_dataplus._M_p + 8) = &test_data1;
              *(float ***)((long)op._M_dataplus._M_p + 0x10) = &test_q1;
              *(size_t **)((long)op._M_dataplus._M_p + 0x18) = &size_1;
              op.field_2._8_8_ =
                   std::
                   _Function_handler<float_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-quantize-perf.cpp:332:40)>
                   ::_M_invoke;
              op.field_2._M_allocated_capacity =
                   (size_type)
                   std::
                   _Function_handler<float_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-quantize-perf.cpp:332:40)>
                   ::_M_manager;
              benchmark_function(sVar3,sVar13,iterations,(function<float_()> *)&op);
              std::_Function_base::~_Function_base((_Function_base *)&op);
            }
            putchar(10);
          }
          if (local_138.op_vec_dot_q == true) {
            puts("  vec_dot_q");
            (*qfns_cpu->from_float)(test_data1,test_q1,n);
            (*qfns_cpu->from_float)(local_c0,test_q2,n);
            puVar6 = local_138.test_sizes.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            for (puVar23 = local_138.test_sizes.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start; puVar23 != puVar6;
                puVar23 = puVar23 + 1) {
              size_1 = *puVar23;
              uVar18 = size_1 * 4;
              if ((long)uVar18 < 0) {
                fVar24 = (float)(uVar18 >> 1) + (float)(uVar18 >> 1);
              }
              else {
                fVar24 = (float)(long)uVar18;
              }
              printf("    %zu values (%.2f MB)\n",SUB84((double)(fVar24 * 9.536743e-07),0));
              sVar13 = ggml_row_size(uVar22,size_1);
              sVar3 = size_1;
              op.field_2._M_allocated_capacity = 0;
              op.field_2._8_8_ = 0;
              op._M_dataplus._M_p = (pointer)0x0;
              op._M_string_length = 0;
              op._M_dataplus._M_p = (pointer)operator_new(0x20);
              *(ggml_type_traits_cpu ***)op._M_dataplus._M_p = &qfns_cpu;
              *(size_t **)((long)op._M_dataplus._M_p + 8) = &size_1;
              *(float ***)((long)op._M_dataplus._M_p + 0x10) = &test_q1;
              *(float ***)((long)op._M_dataplus._M_p + 0x18) = &test_q2;
              op.field_2._8_8_ =
                   std::
                   _Function_handler<float_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-quantize-perf.cpp:349:40)>
                   ::_M_invoke;
              op.field_2._M_allocated_capacity =
                   (size_type)
                   std::
                   _Function_handler<float_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-quantize-perf.cpp:349:40)>
                   ::_M_manager;
              benchmark_function(sVar3,sVar13,iterations,(function<float_()> *)&op);
              std::_Function_base::~_Function_base((_Function_base *)&op);
            }
            putchar(10);
          }
        }
      }
      else {
        lVar11 = ggml_type_name(uVar22);
        pbVar5 = local_138.include_types.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pbVar4 = local_138.include_types.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (lVar11 == 0) goto LAB_00102a05;
        op._M_dataplus._M_p = (pointer)ggml_type_name(uVar22);
        _Var12 = std::
                 __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const*const>>
                           (pbVar4,pbVar5,&op);
        if (_Var12._M_current !=
            local_138.include_types.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) goto LAB_00102a05;
      }
    }
    ggml_free(local_c8);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&test_out_v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&test_q2_v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&test_q1_v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&test_data2_v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&test_data1_v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    iVar17 = 0;
  }
LAB_00103022:
  std::__cxx11::string::~string((string *)&arg);
  quantize_perf_params::~quantize_perf_params(&local_138);
  return iVar17;
}

Assistant:

int main(int argc, char * argv[]) {
    quantize_perf_params params {};

    // read command line

    bool invalid_param = false;
    std::string arg;
    for (int i = 1; i < argc; i++) {
        arg = argv[i];

        if (arg == "--size") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            size_t size = std::stoi(argv[i]);
            if (size % 32 != 0) {
                fprintf(stderr, "error: size %zu not divisible by 32\n", size);
                invalid_param = true;
                break;
            }
            params.test_sizes.push_back(size);
        } else if (arg == "-3") {
            // quick select sizes that probably fit in CPU caches
            params.test_sizes.push_back(L1_SIZE);
            params.test_sizes.push_back(L2_SIZE);
            params.test_sizes.push_back(L3_SIZE);
        } else if (arg == "-4") {
            // quick select cache sizes + memory
            params.test_sizes.push_back(L1_SIZE);
            params.test_sizes.push_back(L2_SIZE);
            params.test_sizes.push_back(L3_SIZE);
            params.test_sizes.push_back(MEM_SIZE);
        } else if (arg == "--op") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            std::string op {argv[i]};
            if (op == "quantize_row_q_reference") {
                params.op_quantize_row_q_reference = true;
            } else if (op == "quantize_row_q") {
                params.op_quantize_row_q = true;
            } else if (op == "dequantize_row_q") {
                params.op_dequantize_row_q = true;
            } else if (op == "quantize_row_q_dot") {
                params.op_quantize_row_q_dot = true;
            } else if (op == "vec_dot_q") {
                params.op_vec_dot_q = true;
            } else {
                invalid_param = true;
                break;
            }
        } else if (arg == "--type") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            params.include_types.push_back(argv[i]);
        } else if (arg == "--alignment-offset") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            int alignment = std::stoi(argv[i]);
            if (alignment < 0 || alignment > MAX_ALIGNMENT) {
            fprintf(stderr, "error: alignment-offset must be less than %d\n", MAX_ALIGNMENT);
                invalid_param = true;
                break;
            }
            params.alignment_offset = alignment;
        } else if ((arg == "-i") || (arg == "--iterations")) {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            int number = std::stoi(argv[i]);
            if (number < 0 || number > MAX_ITERATIONS) {
            fprintf(stderr, "error: iterations must be less than %d\n", MAX_ITERATIONS);
                invalid_param = true;
                break;
            }
            params.iterations = number;
        } else if ((arg == "-h") || (arg == "--help")) {
            usage(argv);
            return 1;
        } else {
            fprintf(stderr, "error: unknown argument: %s\n", arg.c_str());
            return 1;
        }
    }
    if (invalid_param) {
        fprintf(stderr, "error: invalid parameter for argument: %s\n", arg.c_str());
        return 1;
    }

    if (params.test_sizes.empty()) {
        params.test_sizes.push_back(L1_SIZE);
    }
    if (!(params.op_quantize_row_q_reference || params.op_quantize_row_q || params.op_dequantize_row_q || params.op_quantize_row_q_dot || params.op_vec_dot_q)) {
        params.op_quantize_row_q_reference = params.op_quantize_row_q = params.op_dequantize_row_q = params.op_quantize_row_q_dot = params.op_vec_dot_q = true;
    }

    std::sort(params.test_sizes.begin(), params.test_sizes.end());
    size_t largest = params.test_sizes.back();

    std::vector<uint8_t> test_data1_v(largest*4 + MAX_ALIGNMENT*2);
    std::vector<uint8_t> test_data2_v(largest*4 + MAX_ALIGNMENT*2);
    std::vector<uint8_t> test_q1_v   (largest*4 + MAX_ALIGNMENT*2);
    std::vector<uint8_t> test_q2_v   (largest*4 + MAX_ALIGNMENT*2);
    std::vector<uint8_t> test_out_v  (largest*4 + MAX_ALIGNMENT*2);

    float * test_data1 = (float *) align_with_offset(test_data1_v.data(), params.alignment_offset);
    float * test_data2 = (float *) align_with_offset(test_data2_v.data(), params.alignment_offset);
    float * test_q1    = (float *) align_with_offset(test_q1_v.data(),    params.alignment_offset);
    float * test_q2    = (float *) align_with_offset(test_q2_v.data(),    params.alignment_offset);
    float * test_out   = (float *) align_with_offset(test_out_v.data(),   params.alignment_offset);

    generate_data(0, largest, test_data1);
    generate_data(1, largest, test_data2);

    int64_t iterations = params.iterations;


    // Initialize GGML, ensures float conversion tables are initialized
    struct ggml_init_params ggml_params = {
        /* .mem_size   = */ 1*1024,
        /* .mem_buffer = */ NULL,
        /* .no_alloc   = */ true,
    };
    struct ggml_context * ctx = ggml_init(ggml_params);

    for (int i = 0; i < GGML_TYPE_COUNT; i++) {
        ggml_type type = (ggml_type) i;
        const auto * qfns = ggml_get_type_traits(type);
        const auto * qfns_cpu = ggml_get_type_traits_cpu(type);
        if (!params.include_types.empty() && ggml_type_name(type) && std::find(params.include_types.begin(), params.include_types.end(), ggml_type_name(type)) == params.include_types.end()) {
            continue;
        }

        if (qfns_cpu->from_float && qfns->to_float) {
            printf("%s\n", ggml_type_name(type));

            ggml_quantize_init(type);

            if (params.op_quantize_row_q_reference) {
                printf("  quantize_row_q_reference\n");
                for (size_t size : params.test_sizes) {
                    printf("    %zu values (%.2f MB)\n", size, 4*size/(float)(1024*1024));
                    auto quantize_fn = [&](void) -> float {
                        qfns->from_float_ref(test_data1, test_q1, size);
                        return test_q1[0];
                    };
                    size_t quantized_size = ggml_row_size(type, size);
                    benchmark_function(size, quantized_size, iterations, quantize_fn);
                }
                printf("\n");
            }

            if (params.op_quantize_row_q) {
                printf("  quantize_row_q\n");
                for (size_t size : params.test_sizes) {
                    printf("    %zu values (%.2f MB)\n", size, 4*size/(float)(1024*1024));
                    auto quantize_fn = [&](void) -> float {
                        qfns_cpu->from_float(test_data1, test_q1, size);
                        return test_q1[0];
                    };
                    size_t quantized_size = ggml_row_size(type, size);
                    benchmark_function(size, quantized_size, iterations, quantize_fn);
                }
                printf("\n");
            }

            if (params.op_dequantize_row_q) {
                printf("  dequantize_row_q\n");
                qfns_cpu->from_float(test_data1, test_q1, largest);
                for (size_t size : params.test_sizes) {
                    printf("    %zu values (%.2f MB)\n", size, 4*size/(float)(1024*1024));
                    auto quantize_fn = [&](void) -> float {
                        qfns->to_float(test_q1, test_out, size);
                        return test_out[0];
                    };
                    size_t quantized_size = ggml_row_size(type, size);
                    benchmark_function(size, quantized_size, iterations, quantize_fn);
                }
                printf("\n");
            }

            if (params.op_quantize_row_q_dot) {
                printf("  quantize_row_q_dot\n");
                for (size_t size : params.test_sizes) {
                    printf("    %zu values (%.2f MB)\n", size, 4*size/(float)(1024*1024));
                    auto quantize_fn = [&](void) -> float {
                        const auto * vdot = ggml_get_type_traits_cpu(qfns_cpu->vec_dot_type);
                        vdot->from_float(test_data1, test_q1, size);
                        return test_q1[0];
                    };
                    size_t quantized_size = ggml_row_size(type, size);
                    benchmark_function(size, quantized_size, iterations, quantize_fn);
                }
                printf("\n");
            }

            if (params.op_vec_dot_q) {
                printf("  vec_dot_q\n");
                qfns_cpu->from_float(test_data1, test_q1, largest);
                qfns_cpu->from_float(test_data2, test_q2, largest);
                for (size_t size : params.test_sizes) {
                    printf("    %zu values (%.2f MB)\n", size, 4*size/(float)(1024*1024));
                    auto quantize_fn = [&](void) -> float {
                        float result;
                        qfns_cpu->vec_dot(size, &result, 0, test_q1, 0, test_q2, 0, 1);
                        return result;
                    };
                    size_t quantized_size = ggml_row_size(type, size);
                    benchmark_function(size, quantized_size, iterations, quantize_fn);
                }
                printf("\n");
            }
        }
    }

    ggml_free(ctx);

    return 0;
}